

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDV.cpp
# Opt level: O2

void __thiscall
Storage::MassStorage::HDV::set_block
          (HDV *this,size_t address,vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  ulong offset;
  size_t in_RCX;
  void *__buf;
  
  offset = offset_for_block(this,address - 0x40);
  if (-1 < (long)(address - 0x40 | offset)) {
    FileHolder::seek(&this->file_,offset,0);
    FileHolder::write(&this->file_,(int)data,__buf,in_RCX);
    return;
  }
  return;
}

Assistant:

void HDV::set_block(size_t address, const std::vector<uint8_t> &data) {
	const auto source_address = mapper_.to_source_address(address);
	const auto file_offset = offset_for_block(source_address);

	if(source_address >= 0 && file_offset >= 0) {
		file_.seek(file_offset, SEEK_SET);
		file_.write(data);
	}
}